

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void Logger::initialize(void)

{
  ostream *poVar1;
  ofstream local_218 [8];
  string logfile_filename;
  allocator<char> local_11;
  
  std::ofstream::ofstream(local_218);
  std::ofstream::operator=(&instance,local_218);
  std::ofstream::~ofstream(local_218);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_218,"stdout.log",&local_11);
  poVar1 = std::operator<<((ostream *)&std::cout,"Writing into logfile \x1b[1m");
  poVar1 = std::operator<<(poVar1,(string *)local_218);
  poVar1 = std::operator<<(poVar1,"\x1b[0m");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ofstream::open((string *)&instance,(_Ios_Openmode)local_218);
  instance.timestamp_start = time((time_t *)0x0);
  std::__cxx11::string::~string((string *)local_218);
  return;
}

Assistant:

void Logger::initialize() {
  instance.logfile = std::ofstream();

  std::string logfile_filename = "stdout.log";
  std::cout << "Writing into logfile " FF_BOLD << logfile_filename << F_RESET << std::endl;
  // we need to open the log file in append mode because the run_benchmark script writes values into it
  instance.logfile.open(logfile_filename, std::ios::out | std::ios::app);
  instance.timestamp_start = (unsigned long) time(nullptr);
}